

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                         size_t out_size,uint32_t limit)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  lzma_lzma_state lVar9;
  lzma_lzma_state lVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint32_t len;
  uint32_t back;
  uint32_t local_8c;
  uint8_t *local_88;
  size_t local_80;
  uint local_74;
  probability *local_70;
  probability *local_68;
  probability *local_60;
  probability (*local_58) [16];
  probability *local_50;
  probability (*local_48) [16];
  lzma_length_encoder *local_40;
  probability (*local_38) [768];
  
  local_88 = out;
  local_80 = out_size;
  if (coder->is_initialized == false) {
    uVar3 = mf->read_pos;
    if (uVar3 != mf->read_ahead) {
      __assert_fail("mf_position(mf) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x10e,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
    }
    if (uVar3 == mf->read_limit) {
      if (mf->action == LZMA_RUN) {
        return LZMA_OK;
      }
      if (mf->write_pos != uVar3) {
        __assert_fail("mf->write_pos == mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x115,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
      }
      if (mf->action != LZMA_FINISH) {
        __assert_fail("mf->action == LZMA_FINISH",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x116,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
      }
    }
    else {
      uVar14 = 1;
      (*mf->skip)(mf,1);
      mf->read_ahead = 0;
      sVar12 = (coder->rc).count;
      (coder->rc).symbols[sVar12] = RC_BIT_0;
      (coder->rc).probs[sVar12] = coder->is_match[0];
      (coder->rc).count = sVar12 + 1;
      bVar1 = *mf->buffer;
      uVar17 = 7;
      lVar13 = sVar12 + 0x23;
      do {
        lVar11 = lVar13;
        bVar18 = (bVar1 >> (uVar17 & 0x1f) & 1) != 0;
        *(uint *)((long)coder + lVar11 * 4 + -0x60) = (uint)bVar18;
        *(probability **)((coder->rc).symbols + lVar11 * 2 + -10) = coder->literal[0] + uVar14;
        uVar14 = (ulong)((uint)bVar18 + (int)uVar14 * 2);
        bVar18 = uVar17 != 0;
        uVar17 = uVar17 - 1;
        lVar13 = lVar11 + 1;
      } while (bVar18);
      (coder->rc).count = lVar11 - 0x21;
    }
    coder->is_initialized = true;
  }
  uVar3 = mf->read_pos;
  uVar4 = mf->read_ahead;
  _Var6 = rc_encode(&coder->rc,local_88,out_pos,local_80);
  if (!_Var6) {
    uVar17 = uVar3 - uVar4;
    local_58 = coder->is_match;
    local_60 = coder->is_rep;
    local_68 = coder->is_rep0;
    local_70 = coder->is_rep1;
    local_50 = coder->is_rep2;
    local_48 = coder->is_rep0_long;
    local_40 = &coder->rep_len_encoder;
    local_38 = coder->literal;
    do {
      if ((limit != 0xffffffff) &&
         ((limit <= mf->read_pos - mf->read_ahead ||
          (0xeffe < *out_pos + (coder->rc).cache_size + 4)))) {
LAB_00444f10:
        if (coder->is_flushed == false) {
          coder->is_flushed = true;
          if (limit == 0xffffffff) {
            uVar17 = uVar17 & coder->pos_mask;
            lVar10 = coder->state;
            sVar12 = (coder->rc).count;
            (coder->rc).symbols[sVar12] = RC_BIT_1;
            (coder->rc).probs[sVar12] = coder->is_match[lVar10] + uVar17;
            (coder->rc).count = sVar12 + 1;
            lVar10 = coder->state;
            (coder->rc).symbols[sVar12 + 1] = RC_BIT_0;
            (coder->rc).probs[sVar12 + 1] = coder->is_rep + lVar10;
            (coder->rc).count = sVar12 + 2;
            match(coder,uVar17,0xffffffff,2);
          }
          sVar12 = (coder->rc).count;
          lVar13 = 5;
          do {
            (coder->rc).symbols[sVar12] = RC_FLUSH;
            sVar12 = sVar12 + 1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          (coder->rc).count = sVar12;
          _Var6 = rc_encode(&coder->rc,local_88,out_pos,local_80);
          if (_Var6) {
            if (limit == 0xffffffff) {
              return LZMA_OK;
            }
            __assert_fail("limit == UINT32_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                          ,0x188,
                          "lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                         );
          }
        }
        coder->is_flushed = false;
        return LZMA_STREAM_END;
      }
      if (mf->read_limit <= mf->read_pos) {
        if (mf->action == LZMA_RUN) {
          return LZMA_OK;
        }
        if (mf->read_ahead == 0) goto LAB_00444f10;
      }
      if (coder->fast_mode == true) {
        lzma_lzma_optimum_fast(coder,mf,&local_74,&local_8c);
      }
      else {
        lzma_lzma_optimum_normal(coder,mf,&local_74,&local_8c,uVar17);
      }
      uVar3 = local_8c;
      uVar14 = (ulong)local_74;
      uVar7 = coder->pos_mask & uVar17;
      if (uVar14 == 0xffffffff) {
        if (local_8c != 1) {
          __assert_fail("len == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                        ,0xf1,
                        "void encode_symbol(lzma_lzma1_encoder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                       );
        }
        lVar10 = coder->state;
        sVar12 = (coder->rc).count;
        (coder->rc).symbols[sVar12] = RC_BIT_0;
        (coder->rc).probs[sVar12] = local_58[lVar10] + uVar7;
        (coder->rc).count = sVar12 + 1;
        uVar7 = mf->read_pos - mf->read_ahead;
        puVar5 = mf->buffer;
        bVar1 = (byte)coder->literal_context_bits;
        bVar2 = puVar5[uVar7];
        uVar16 = (uint)(puVar5[uVar7 - 1] >> (8 - bVar1 & 0x1f)) +
                 ((coder->literal_pos_mask & uVar17) << (bVar1 & 0x1f));
        if (coder->state < STATE_LIT_MATCH) {
          lVar13 = sVar12 + 0x23;
          uVar14 = 1;
          uVar7 = 7;
          do {
            bVar18 = (bVar2 >> (uVar7 & 0x1f) & 1) != 0;
            *(uint *)((long)coder + lVar13 * 4 + -0x60) = (uint)bVar18;
            *(probability **)((coder->rc).symbols + lVar13 * 2 + -10) = local_38[uVar16] + uVar14;
            uVar14 = (ulong)((uint)bVar18 + (int)uVar14 * 2);
            lVar13 = lVar13 + 1;
            bVar18 = uVar7 != 0;
            uVar7 = uVar7 - 1;
          } while (bVar18);
        }
        else {
          uVar7 = (uint)puVar5[uVar7 + ~coder->reps[0]];
          uVar8 = bVar2 | 0x100;
          lVar13 = sVar12 + 0x23;
          uVar15 = 0x100;
          do {
            uVar7 = uVar7 * 2;
            *(uint *)((long)coder + lVar13 * 4 + -0x60) = uVar8 >> 7 & 1;
            *(probability **)((coder->rc).symbols + lVar13 * 2 + -10) =
                 local_38[uVar16] + ((uVar8 >> 8) + uVar15 + (uVar7 & uVar15));
            uVar8 = uVar8 * 2;
            uVar15 = uVar15 & ~(uVar8 ^ uVar7);
            lVar13 = lVar13 + 1;
          } while (uVar8 < 0x10000);
        }
        (coder->rc).count = lVar13 - 0x22;
        lVar10 = coder->state;
        lVar9 = STATE_LIT_LIT;
        if (STATE_SHORTREP_LIT_LIT < lVar10) {
          if (lVar10 < STATE_NONLIT_MATCH) {
            lVar9 = lVar10 - STATE_SHORTREP_LIT_LIT;
          }
          else {
            lVar9 = lVar10 - STATE_SHORTREP_LIT;
          }
        }
        coder->state = lVar9;
      }
      else {
        lVar10 = coder->state;
        sVar12 = (coder->rc).count;
        (coder->rc).symbols[sVar12] = RC_BIT_1;
        (coder->rc).probs[sVar12] = local_58[lVar10] + uVar7;
        (coder->rc).count = sVar12 + 1;
        lVar10 = coder->state;
        if (local_74 < 4) {
          (coder->rc).symbols[sVar12 + 1] = RC_BIT_1;
          (coder->rc).probs[sVar12 + 1] = local_60 + lVar10;
          (coder->rc).count = sVar12 + 2;
          if (uVar14 == 0) {
            lVar10 = coder->state;
            (coder->rc).symbols[sVar12 + 2] = RC_BIT_0;
            (coder->rc).probs[sVar12 + 2] = local_68 + lVar10;
            (coder->rc).count = sVar12 + 3;
            lVar10 = coder->state;
            (coder->rc).symbols[sVar12 + 3] = (uint)(local_8c != 1);
            (coder->rc).probs[sVar12 + 3] = local_48[lVar10] + uVar7;
            (coder->rc).count = sVar12 + 4;
          }
          else {
            uVar4 = coder->reps[uVar14];
            lVar10 = coder->state;
            (coder->rc).symbols[sVar12 + 2] = RC_BIT_1;
            (coder->rc).probs[sVar12 + 2] = local_68 + lVar10;
            (coder->rc).count = sVar12 + 3;
            lVar10 = coder->state;
            if (uVar14 == 1) {
              (coder->rc).symbols[sVar12 + 3] = RC_BIT_0;
              (coder->rc).probs[sVar12 + 3] = local_70 + lVar10;
              (coder->rc).count = sVar12 + 4;
            }
            else {
              (coder->rc).symbols[sVar12 + 3] = RC_BIT_1;
              (coder->rc).probs[sVar12 + 3] = local_70 + lVar10;
              (coder->rc).count = sVar12 + 4;
              lVar10 = coder->state;
              (coder->rc).symbols[sVar12 + 4] = local_74 - RC_DIRECT_0;
              (coder->rc).probs[sVar12 + 4] = local_50 + lVar10;
              (coder->rc).count = sVar12 + 5;
              if (uVar14 == 3) {
                coder->reps[3] = coder->reps[2];
              }
              coder->reps[2] = coder->reps[1];
            }
            coder->reps[1] = coder->reps[0];
            coder->reps[0] = uVar4;
          }
          if (local_8c == 1) {
            lVar10 = (uint)(STATE_SHORTREP_LIT < coder->state) * 2 + STATE_LIT_SHORTREP;
          }
          else {
            length(&coder->rc,local_40,uVar7,local_8c,coder->fast_mode);
            lVar10 = (uint)(STATE_SHORTREP_LIT < coder->state) * 3 + STATE_LIT_LONGREP;
          }
          coder->state = lVar10;
        }
        else {
          (coder->rc).symbols[sVar12 + 1] = RC_BIT_0;
          (coder->rc).probs[sVar12 + 1] = local_60 + lVar10;
          (coder->rc).count = sVar12 + 2;
          match(coder,uVar7,local_74 - 4,local_8c);
        }
      }
      if (mf->read_ahead < uVar3) {
        __assert_fail("mf->read_ahead >= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x106,
                      "void encode_symbol(lzma_lzma1_encoder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                     );
      }
      mf->read_ahead = mf->read_ahead - uVar3;
      uVar17 = uVar17 + local_8c;
      _Var6 = rc_encode(&coder->rc,local_88,out_pos,local_80);
    } while (!_Var6);
  }
  if (limit == 0xffffffff) {
    return LZMA_OK;
  }
  __assert_fail("limit == UINT32_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                ,0x14b,
                "lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
               );
}

Assistant:

extern lzma_ret
lzma_lzma_encode(lzma_lzma1_encoder *restrict coder, lzma_mf *restrict mf,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size, uint32_t limit)
{
	// Initialize the stream if no data has been encoded yet.
	if (!coder->is_initialized && !encode_init(coder, mf))
		return LZMA_OK;

	// Get the lowest bits of the uncompressed offset from the LZ layer.
	uint32_t position = mf_position(mf);

	while (true) {
		// Encode pending bits, if any. Calling this before encoding
		// the next symbol is needed only with plain LZMA, since
		// LZMA2 always provides big enough buffer to flush
		// everything out from the range encoder. For the same reason,
		// rc_encode() never returns true when this function is used
		// as part of LZMA2 encoder.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}

		// With LZMA2 we need to take care that compressed size of
		// a chunk doesn't get too big.
		// FIXME? Check if this could be improved.
		if (limit != UINT32_MAX
				&& (mf->read_pos - mf->read_ahead >= limit
					|| *out_pos + rc_pending(&coder->rc)
						>= LZMA2_CHUNK_MAX
							- LOOP_INPUT_MAX))
			break;

		// Check that there is some input to process.
		if (mf->read_pos >= mf->read_limit) {
			if (mf->action == LZMA_RUN)
				return LZMA_OK;

			if (mf->read_ahead == 0)
				break;
		}

		// Get optimal match (repeat position and length).
		// Value ranges for pos:
		//   - [0, REPS): repeated match
		//   - [REPS, UINT32_MAX):
		//     match at (pos - REPS)
		//   - UINT32_MAX: not a match but a literal
		// Value ranges for len:
		//   - [MATCH_LEN_MIN, MATCH_LEN_MAX]
		uint32_t len;
		uint32_t back;

		if (coder->fast_mode)
			lzma_lzma_optimum_fast(coder, mf, &back, &len);
		else
			lzma_lzma_optimum_normal(
					coder, mf, &back, &len, position);

		encode_symbol(coder, mf, back, len, position);

		position += len;
	}

	if (!coder->is_flushed) {
		coder->is_flushed = true;

		// We don't support encoding plain LZMA streams without EOPM,
		// and LZMA2 doesn't use EOPM at LZMA level.
		if (limit == UINT32_MAX)
			encode_eopm(coder, position);

		// Flush the remaining bytes from the range encoder.
		rc_flush(&coder->rc);

		// Copy the remaining bytes to the output buffer. If there
		// isn't enough output space, we will copy out the remaining
		// bytes on the next call to this function by using
		// the rc_encode() call in the encoding loop above.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}
	}

	// Make it ready for the next LZMA2 chunk.
	coder->is_flushed = false;

	return LZMA_STREAM_END;
}